

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_writer.cpp
# Opt level: O1

void __thiscall duckdb::MetadataWriter::NextBlock(MetadataWriter *this)

{
  pointer *ppMVar1;
  BlockManager *pBVar2;
  vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_> *this_00;
  iterator __position;
  MetadataPointer MVar3;
  MetadataPointer *pMVar4;
  idx_t iVar5;
  idx_t iVar6;
  data_ptr_t pdVar7;
  MetadataHandle new_handle;
  MetaBlockPointer local_50;
  MetadataPointer local_40;
  BufferHandle local_38;
  
  (*(this->super_WriteStream)._vptr_WriteStream[3])(&local_40,this);
  MVar3 = local_40;
  if (this->capacity != 0) {
    pMVar4 = (MetadataPointer *)BasePtr(this);
    *pMVar4 = MVar3;
  }
  (this->block).pointer = local_40;
  BufferHandle::operator=(&(this->block).handle,&local_38);
  this->current_pointer = (this->block).pointer;
  this->offset = 8;
  pBVar2 = this->manager->block_manager;
  iVar5 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
  iVar6 = optional_idx::GetIndex(&pBVar2->block_header_size);
  this->capacity = iVar5 - iVar6 >> 6 & 0xfffffffffffffff8;
  pdVar7 = BasePtr(this);
  pdVar7[0] = 0xff;
  pdVar7[1] = 0xff;
  pdVar7[2] = 0xff;
  pdVar7[3] = 0xff;
  pdVar7[4] = 0xff;
  pdVar7[5] = 0xff;
  pdVar7[6] = 0xff;
  pdVar7[7] = 0xff;
  if ((this->written_pointers).ptr != (vector<duckdb::MetaBlockPointer,_true> *)0x0) {
    optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>::CheckValid
              (&this->written_pointers);
    this_00 = &((this->written_pointers).ptr)->
               super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>;
    local_50.block_pointer = *(idx_t *)&this->current_pointer;
    local_50.offset = 0;
    local_50.unused_padding = 0;
    __position._M_current =
         (this_00->
         super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->
        super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::
      _M_realloc_insert<duckdb::MetaBlockPointer>(this_00,__position,&local_50);
    }
    else {
      (__position._M_current)->block_pointer = local_50.block_pointer;
      (__position._M_current)->offset = 0;
      (__position._M_current)->unused_padding = 0;
      ppMVar1 = &(this_00->
                 super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
  }
  BufferHandle::~BufferHandle(&local_38);
  return;
}

Assistant:

void MetadataWriter::NextBlock() {
	// now we need to get a new block id
	auto new_handle = NextHandle();

	// write the block id of the new block to the start of the current block
	if (capacity > 0) {
		auto disk_block = manager.GetDiskPointer(new_handle.pointer);
		Store<idx_t>(disk_block.block_pointer, BasePtr());
	}
	// now update the block id of the block
	block = std::move(new_handle);
	current_pointer = block.pointer;
	offset = sizeof(idx_t);
	capacity = GetManager().GetMetadataBlockSize();
	Store<idx_t>(static_cast<idx_t>(-1), BasePtr());
	if (written_pointers) {
		written_pointers->push_back(manager.GetDiskPointer(current_pointer));
	}
}